

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::LocalSingleStoreElimPass::FindSingleStoreAndCheckUses
          (LocalSingleStoreElimPass *this,Instruction *var_inst,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *users
          )

{
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  CommonDebugInfoInstructions CVar4;
  reference ppIVar5;
  CommonDebugInfoInstructions dbg_op;
  Instruction *user;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction *store_inst;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *users_local;
  Instruction *var_inst_local;
  LocalSingleStoreElimPass *this_local;
  
  __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             0x0;
  uVar2 = Instruction::NumInOperands(var_inst);
  if (1 < uVar2) {
    __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)var_inst;
  }
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(users);
  user = (Instruction *)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end(users);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&user);
    if (!bVar1) {
      return (Instruction *)__range2;
    }
    ppIVar5 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    this_00 = *ppIVar5;
    OVar3 = Instruction::opcode(this_00);
    switch(OVar3) {
    case OpName:
    case OpImageTexelPointer:
    case OpLoad:
    case OpCopyObject:
      break;
    default:
      bVar1 = Instruction::IsDecoration(this_00);
      if (!bVar1) {
        return (Instruction *)0x0;
      }
      break;
    case OpExtInst:
      CVar4 = Instruction::GetCommonDebugOpcode(this_00);
      if ((CVar4 != CommonDebugInfoDebugDeclare) && (CVar4 != CommonDebugInfoDebugValue)) {
        return (Instruction *)0x0;
      }
      break;
    case OpStore:
      bVar1 = __range2 !=
              (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )0x0;
      __range2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this_00;
      if (bVar1) {
        return (Instruction *)0x0;
      }
      break;
    case OpAccessChain:
    case OpInBoundsAccessChain:
      bVar1 = FeedsAStore(this,this_00);
      if (bVar1) {
        return (Instruction *)0x0;
      }
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Instruction* LocalSingleStoreElimPass::FindSingleStoreAndCheckUses(
    Instruction* var_inst, const std::vector<Instruction*>& users) const {
  // Make sure there is exactly 1 store.
  Instruction* store_inst = nullptr;

  // If |var_inst| has an initializer, then that will count as a store.
  if (var_inst->NumInOperands() > 1) {
    store_inst = var_inst;
  }

  for (Instruction* user : users) {
    switch (user->opcode()) {
      case spv::Op::OpStore:
        // Since we are in the relaxed addressing mode, the use has to be the
        // base address of the store, and not the value being store.  Otherwise,
        // we would have a pointer to a pointer to function scope memory, which
        // is not allowed.
        if (store_inst == nullptr) {
          store_inst = user;
        } else {
          // More than 1 store.
          return nullptr;
        }
        break;
      case spv::Op::OpAccessChain:
      case spv::Op::OpInBoundsAccessChain:
        if (FeedsAStore(user)) {
          // Has a partial store.  Cannot propagate that.
          return nullptr;
        }
        break;
      case spv::Op::OpLoad:
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
      case spv::Op::OpCopyObject:
        break;
      case spv::Op::OpExtInst: {
        auto dbg_op = user->GetCommonDebugOpcode();
        if (dbg_op == CommonDebugInfoDebugDeclare ||
            dbg_op == CommonDebugInfoDebugValue) {
          break;
        }
        return nullptr;
      }
      default:
        if (!user->IsDecoration()) {
          // Don't know if this instruction modifies the variable.
          // Conservatively assume it is a store.
          return nullptr;
        }
        break;
    }
  }
  return store_inst;
}